

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O1

void g_mycanvas_setup(void)

{
  _class *p_Var1;
  undefined8 in_RAX;
  uint uVar3;
  t_symbol *ptVar2;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  ptVar2 = gensym("cnv");
  my_canvas_class =
       class_new(ptVar2,my_canvas_new,my_canvas_free,0x4c8,8,A_GIMME,(ulong)uVar3 << 0x20);
  ptVar2 = gensym("my_canvas");
  class_addcreator(my_canvas_new,ptVar2,A_GIMME,0);
  p_Var1 = my_canvas_class;
  ptVar2 = gensym("dialog");
  class_addmethod(p_Var1,my_canvas_dialog,ptVar2,A_GIMME,0);
  p_Var1 = my_canvas_class;
  ptVar2 = gensym("size");
  class_addmethod(p_Var1,my_canvas_size,ptVar2,A_GIMME,0);
  p_Var1 = my_canvas_class;
  ptVar2 = gensym("delta");
  class_addmethod(p_Var1,my_canvas_delta,ptVar2,A_GIMME,0);
  p_Var1 = my_canvas_class;
  ptVar2 = gensym("pos");
  class_addmethod(p_Var1,my_canvas_pos,ptVar2,A_GIMME,0);
  p_Var1 = my_canvas_class;
  ptVar2 = gensym("vis_size");
  class_addmethod(p_Var1,my_canvas_vis_size,ptVar2,A_GIMME,0);
  p_Var1 = my_canvas_class;
  ptVar2 = gensym("color");
  class_addmethod(p_Var1,my_canvas_color,ptVar2,A_GIMME,0);
  p_Var1 = my_canvas_class;
  ptVar2 = gensym("send");
  class_addmethod(p_Var1,my_canvas_send,ptVar2,A_DEFSYM,0);
  p_Var1 = my_canvas_class;
  ptVar2 = gensym("receive");
  class_addmethod(p_Var1,my_canvas_receive,ptVar2,A_DEFSYM,0);
  p_Var1 = my_canvas_class;
  ptVar2 = gensym("label");
  class_addmethod(p_Var1,my_canvas_label,ptVar2,A_DEFSYM,0);
  p_Var1 = my_canvas_class;
  ptVar2 = gensym("label_pos");
  class_addmethod(p_Var1,my_canvas_label_pos,ptVar2,A_GIMME,0);
  p_Var1 = my_canvas_class;
  ptVar2 = gensym("label_font");
  class_addmethod(p_Var1,my_canvas_label_font,ptVar2,A_GIMME,0);
  p_Var1 = my_canvas_class;
  ptVar2 = gensym("get_pos");
  class_addmethod(p_Var1,my_canvas_get_pos,ptVar2,A_NULL);
  p_Var1 = my_canvas_class;
  ptVar2 = gensym("zoom");
  class_addmethod(p_Var1,iemgui_zoom,ptVar2,A_CANT,0);
  my_canvas_widgetbehavior.w_getrectfn = my_canvas_getrect;
  my_canvas_widgetbehavior.w_displacefn = iemgui_displace;
  my_canvas_widgetbehavior.w_selectfn = iemgui_select;
  my_canvas_widgetbehavior.w_activatefn = (t_activatefn)0x0;
  my_canvas_widgetbehavior.w_deletefn = iemgui_delete;
  my_canvas_widgetbehavior.w_visfn = iemgui_vis;
  my_canvas_widgetbehavior.w_clickfn = (t_clickfn)0x0;
  class_setwidget(my_canvas_class,&my_canvas_widgetbehavior);
  class_setsavefn(my_canvas_class,my_canvas_save);
  class_setpropertiesfn(my_canvas_class,my_canvas_properties);
  return;
}

Assistant:

void g_mycanvas_setup(void)
{
    my_canvas_class = class_new(gensym("cnv"), (t_newmethod)my_canvas_new,
        (t_method)my_canvas_free, sizeof(t_my_canvas), CLASS_NOINLET, A_GIMME, 0);
    class_addcreator((t_newmethod)my_canvas_new, gensym("my_canvas"), A_GIMME, 0);
    class_addmethod(my_canvas_class, (t_method)my_canvas_dialog,
        gensym("dialog"), A_GIMME, 0);
    class_addmethod(my_canvas_class, (t_method)my_canvas_size,
        gensym("size"), A_GIMME, 0);
    class_addmethod(my_canvas_class, (t_method)my_canvas_delta,
        gensym("delta"), A_GIMME, 0);
    class_addmethod(my_canvas_class, (t_method)my_canvas_pos,
        gensym("pos"), A_GIMME, 0);
    class_addmethod(my_canvas_class, (t_method)my_canvas_vis_size,
        gensym("vis_size"), A_GIMME, 0);
    class_addmethod(my_canvas_class, (t_method)my_canvas_color,
        gensym("color"), A_GIMME, 0);
    class_addmethod(my_canvas_class, (t_method)my_canvas_send,
        gensym("send"), A_DEFSYM, 0);
    class_addmethod(my_canvas_class, (t_method)my_canvas_receive,
        gensym("receive"), A_DEFSYM, 0);
    class_addmethod(my_canvas_class, (t_method)my_canvas_label,
        gensym("label"), A_DEFSYM, 0);
    class_addmethod(my_canvas_class, (t_method)my_canvas_label_pos,
        gensym("label_pos"), A_GIMME, 0);
    class_addmethod(my_canvas_class, (t_method)my_canvas_label_font,
        gensym("label_font"), A_GIMME, 0);
    class_addmethod(my_canvas_class, (t_method)my_canvas_get_pos,
        gensym("get_pos"), 0);
    class_addmethod(my_canvas_class, (t_method)iemgui_zoom,
        gensym("zoom"), A_CANT, 0);
    my_canvas_widgetbehavior.w_getrectfn  = my_canvas_getrect;
    my_canvas_widgetbehavior.w_displacefn = iemgui_displace;
    my_canvas_widgetbehavior.w_selectfn   = iemgui_select;
    my_canvas_widgetbehavior.w_activatefn = NULL;
    my_canvas_widgetbehavior.w_deletefn   = iemgui_delete;
    my_canvas_widgetbehavior.w_visfn      = iemgui_vis;
    my_canvas_widgetbehavior.w_clickfn    = NULL;
    class_setwidget(my_canvas_class, &my_canvas_widgetbehavior);
    class_setsavefn(my_canvas_class, my_canvas_save);
    class_setpropertiesfn(my_canvas_class, my_canvas_properties);
}